

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

jvirt_barray_ptr
request_virt_barray(j_common_ptr cinfo,int pool_id,boolean pre_zero,JDIMENSION blocksperrow,
                   JDIMENSION numrows,JDIMENSION maxaccess)

{
  jpeg_memory_mgr *pjVar1;
  jvirt_barray_ptr pjVar2;
  jvirt_barray_ptr result;
  my_mem_ptr mem;
  JDIMENSION maxaccess_local;
  JDIMENSION numrows_local;
  JDIMENSION blocksperrow_local;
  boolean pre_zero_local;
  int pool_id_local;
  j_common_ptr cinfo_local;
  
  pjVar1 = cinfo->mem;
  if (pool_id != 1) {
    cinfo->err->msg_code = 0xf;
    (cinfo->err->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  pjVar2 = (jvirt_barray_ptr)alloc_small(cinfo,pool_id,0x98);
  pjVar2->mem_buffer = (JBLOCKARRAY)0x0;
  pjVar2->rows_in_array = numrows;
  pjVar2->blocksperrow = blocksperrow;
  pjVar2->maxaccess = maxaccess;
  pjVar2->pre_zero = pre_zero;
  pjVar2->b_s_open = 0;
  pjVar2->next = (jvirt_barray_ptr)pjVar1[1].request_virt_barray;
  pjVar1[1].request_virt_barray =
       (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)pjVar2;
  return pjVar2;
}

Assistant:

METHODDEF(jvirt_barray_ptr)
request_virt_barray (j_common_ptr cinfo, int pool_id, boolean pre_zero,
		     JDIMENSION blocksperrow, JDIMENSION numrows,
		     JDIMENSION maxaccess)
/* Request a virtual 2-D coefficient-block array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  jvirt_barray_ptr result;

  /* Only IMAGE-lifetime virtual arrays are currently supported */
  if (pool_id != JPOOL_IMAGE)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */

  /* get control block */
  result = (jvirt_barray_ptr) alloc_small(cinfo, pool_id,
					  SIZEOF(struct jvirt_barray_control));

  result->mem_buffer = NULL;	/* marks array not yet realized */
  result->rows_in_array = numrows;
  result->blocksperrow = blocksperrow;
  result->maxaccess = maxaccess;
  result->pre_zero = pre_zero;
  result->b_s_open = FALSE;	/* no associated backing-store object */
  result->next = mem->virt_barray_list; /* add to list of virtual arrays */
  mem->virt_barray_list = result;

  return result;
}